

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Hint.c
# Opt level: O3

int Llb_ManModelCheckAigWithHints(Aig_Man_t *pAigGlo,Gia_ParLlb_t *pPars)

{
  uint uVar1;
  uint uVar2;
  Aig_Man_t *pAVar3;
  int iVar4;
  int iVar5;
  Vec_Int_t *__ptr;
  Vec_Int_t *vHints;
  int *__s;
  long lVar6;
  int level;
  ulong uVar7;
  ulong uVar8;
  DdManager *ddGlo;
  timespec ts;
  DdManager *local_58;
  Aig_Man_t *local_50;
  timespec local_48;
  long local_38;
  
  local_58 = (DdManager *)0x0;
  local_50 = pAigGlo;
  iVar4 = clock_gettime(3,&local_48);
  pAVar3 = local_50;
  if (iVar4 < 0) {
    lVar6 = 1;
  }
  else {
    lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    lVar6 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  if (pPars->nHintDepth < 1) {
    __assert_fail("pPars->nHintDepth > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb1Hint.c"
                  ,0xa9,"int Llb_ManModelCheckAigWithHints(Aig_Man_t *, Gia_ParLlb_t *)");
  }
  __ptr = Llb_ManCollectHighFanoutObjects(local_50,pPars->nHintDepth + pPars->HintFirst,1);
  iVar4 = pAVar3->vObjs->nSize;
  vHints = (Vec_Int_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < iVar4 - 1U) {
    iVar5 = iVar4;
  }
  vHints->nCap = iVar5;
  local_38 = lVar6;
  if (iVar5 == 0) {
    vHints->pArray = (int *)0x0;
    vHints->nSize = iVar4;
  }
  else {
    __s = (int *)malloc((long)iVar5 << 2);
    vHints->pArray = __s;
    vHints->nSize = iVar4;
    if (__s != (int *)0x0) {
      memset(__s,0xff,(long)iVar4 << 2);
    }
  }
  uVar1 = pPars->HintFirst;
  uVar8 = (ulong)uVar1;
  uVar2 = __ptr->nSize;
  iVar4 = -1;
  if ((int)uVar1 < (int)uVar2) {
    do {
      if ((int)uVar1 < 0) goto LAB_00835a25;
      iVar4 = __ptr->pArray[uVar8];
      if (((long)iVar4 < 0) || (vHints->nSize <= iVar4)) goto LAB_00835a06;
      vHints->pArray[iVar4] = 1;
      iVar5 = Llb_ManModelCheckAig(local_50,pPars,vHints,&local_58);
      iVar4 = iVar5;
      if (iVar5 == 0) goto LAB_00835919;
      if (iVar5 == 1) goto LAB_0083589d;
      uVar8 = uVar8 + 1;
    } while ((int)uVar8 < (int)uVar2);
    uVar8 = (ulong)uVar2;
    iVar4 = -1;
    if (iVar5 != -1) {
LAB_0083589d:
      iVar4 = iVar5;
      if (pPars->HintFirst <= (int)uVar8) {
        uVar7 = uVar8 & 0xffffffff;
        do {
          iVar5 = (int)uVar7;
          if ((iVar5 < 0) || ((int)uVar2 <= (int)uVar8)) {
LAB_00835a25:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar4 = __ptr->pArray[uVar7];
          if (((long)iVar4 < 0) || (vHints->nSize <= iVar4)) {
LAB_00835a06:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          vHints->pArray[iVar4] = -1;
          iVar4 = Llb_ManModelCheckAig(local_50,pPars,vHints,&local_58);
          if (iVar4 != 1) goto LAB_00835919;
          uVar7 = (ulong)(iVar5 - 1);
        } while (pPars->HintFirst < iVar5);
        iVar4 = 1;
      }
    }
  }
LAB_00835919:
  if (local_58 != (DdManager *)0x0) {
    if (local_58->bFunc != (DdNode *)0x0) {
      Cudd_RecursiveDeref(local_58,local_58->bFunc);
    }
    Extra_StopManager(local_58);
  }
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  if (vHints->pArray != (int *)0x0) {
    free(vHints->pArray);
  }
  free(vHints);
  if (pPars->fVerbose != 0) {
    level = 3;
    iVar5 = clock_gettime(3,&local_48);
    if (iVar5 < 0) {
      lVar6 = -1;
    }
    else {
      lVar6 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
    }
    lVar6 = lVar6 + local_38;
    Abc_Print(level,"%s =","Total runtime");
    Abc_Print(level,"%9.2f sec\n",(double)lVar6 / 1000000.0);
  }
  return iVar4;
}

Assistant:

int Llb_ManModelCheckAigWithHints( Aig_Man_t * pAigGlo, Gia_ParLlb_t * pPars )
{
    DdManager * ddGlo = NULL;
    Vec_Int_t * vHints;
    Vec_Int_t * vHFCands;
    int i, Entry, RetValue = -1;
    abctime clk = Abc_Clock();
    assert( pPars->nHintDepth > 0 );
/*
    // perform reachability without hints
    RetValue = Llb_ManModelCheckAig( pAigGlo, pPars, NULL, NULL );
    if ( RetValue >= 0 )
        return RetValue;
*/
    // create hints representation
    vHFCands = Llb_ManCollectHighFanoutObjects( pAigGlo, pPars->nHintDepth+pPars->HintFirst, 1 );
    vHints   = Vec_IntStartFull( Aig_ManObjNumMax(pAigGlo) );
    // add one hint at a time till the problem is solved
    Vec_IntForEachEntryStart( vHFCands, Entry, i, pPars->HintFirst )
    {
        Vec_IntWriteEntry( vHints, Entry, 1 );   // change to 1 to start from zero cof!!!
        // solve under hints
        RetValue = Llb_ManModelCheckAig( pAigGlo, pPars, vHints, &ddGlo );
        if ( RetValue == 0 )
            goto Finish;
        if ( RetValue == 1 )
            break;
    }
    if ( RetValue == -1 )
        goto Finish;
    // undo the hints one at a time
    for ( ; i >= pPars->HintFirst; i-- )
    {
        Entry = Vec_IntEntry( vHFCands, i );
        Vec_IntWriteEntry( vHints, Entry, -1 );        
        // solve under relaxed hints
        RetValue = Llb_ManModelCheckAig( pAigGlo, pPars, vHints, &ddGlo );
        if ( RetValue == 0 )
            goto Finish;
        if ( RetValue == 1 )
            continue;
        break;
    }
Finish:
    if ( ddGlo )
    {
        if ( ddGlo->bFunc )
            Cudd_RecursiveDeref( ddGlo, ddGlo->bFunc ); 
        Extra_StopManager( ddGlo );
    }
    Vec_IntFreeP( &vHFCands );
    Vec_IntFreeP( &vHints );
    if ( pPars->fVerbose )
        Abc_PrintTime( 1, "Total runtime", Abc_Clock() - clk );
    return RetValue;
}